

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_panel.cxx
# Opt level: O1

Fl_Double_Window * make_comment_panel(void)

{
  uint *puVar1;
  Fl_Text_Display *pFVar2;
  Fl_Double_Window *this;
  CodeEditor *pCVar3;
  Fl_Light_Button *pFVar4;
  Fl_Window *this_00;
  CodeEditor *this_01;
  Fl_Group *pFVar5;
  Fl_Widget *pFVar6;
  Fl_Window *this_02;
  Fl_Button *pFVar7;
  Fl_Group *pFVar8;
  Fl_Menu_Button *this_03;
  
  this_00 = (Fl_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window((Fl_Double_Window *)this_00,0x226,0x118,"Comment Properties");
  comment_panel = (Fl_Double_Window *)this_00;
  (this_00->super_Fl_Group).super_Fl_Widget.label_.size = 0xb;
  this_01 = (CodeEditor *)operator_new(0x1c0);
  CodeEditor::CodeEditor(this_01,0x6e,10,0x1ae,0xe6,(char *)0x0);
  comment_input = this_01;
  (this_01->super_Fl_Text_Editor).super_Fl_Text_Display.super_Fl_Group.super_Fl_Widget.box_ = '\x03'
  ;
  (this_01->super_Fl_Text_Editor).super_Fl_Text_Display.super_Fl_Group.super_Fl_Widget.color_ = 7;
  (this_01->super_Fl_Text_Editor).super_Fl_Text_Display.super_Fl_Group.super_Fl_Widget.color2_ = 0xf
  ;
  (this_01->super_Fl_Text_Editor).super_Fl_Text_Display.super_Fl_Group.super_Fl_Widget.label_.type =
       '\0';
  pFVar2 = &(this_01->super_Fl_Text_Editor).super_Fl_Text_Display;
  (pFVar2->super_Fl_Group).super_Fl_Widget.label_.font = 0;
  (pFVar2->super_Fl_Group).super_Fl_Widget.label_.size = 0xb;
  (this_01->super_Fl_Text_Editor).super_Fl_Text_Display.super_Fl_Group.super_Fl_Widget.label_.color
       = 0;
  (this_01->super_Fl_Text_Editor).super_Fl_Text_Display.textfont_ = 4;
  (this_01->super_Fl_Text_Editor).super_Fl_Text_Display.mColumnScale = 0.0;
  CodeEditor::textsize(this_01,0xb);
  pCVar3 = comment_input;
  (comment_input->super_Fl_Text_Editor).super_Fl_Text_Display.super_Fl_Group.super_Fl_Widget.label_.
  align_ = 1;
  (pCVar3->super_Fl_Text_Editor).super_Fl_Text_Display.super_Fl_Group.super_Fl_Widget.when_ = '\x04'
  ;
  pFVar5 = Fl_Group::current();
  pFVar5->resizable_ = (Fl_Widget *)comment_input;
  (this_01->super_Fl_Text_Editor).super_Fl_Text_Display.super_Fl_Group.super_Fl_Widget.when_ =
       '\x0f';
  pFVar5 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar5,0x6e,0xfa,0x1ae,0x14,(char *)0x0);
  (pFVar5->super_Fl_Widget).label_.size = 0xb;
  pFVar6 = (Fl_Widget *)operator_new(0x80);
  Fl_Return_Button::Fl_Return_Button((Fl_Return_Button *)pFVar6,0x172,0xfa,0x50,0x14,"OK");
  comment_panel_ok = (Fl_Return_Button *)pFVar6;
  (pFVar6->label_).size = 0xb;
  this_02 = Fl_Widget::window(pFVar6);
  Fl_Window::hotspot(this_02,(Fl_Widget *)comment_panel_ok,0);
  pFVar7 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar7,0x1cc,0xfa,0x50,0x14,"Cancel");
  comment_panel_cancel = pFVar7;
  pFVar7->shortcut_ = 0xff1b;
  (pFVar7->super_Fl_Widget).label_.size = 0xb;
  pFVar6 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar6,0x6e,0xfa,0xfa,0x14,(char *)0x0);
  (pFVar6->label_).size = 0xb;
  pFVar8 = Fl_Group::current();
  pFVar8->resizable_ = pFVar6;
  Fl_Group::end(pFVar5);
  pFVar5 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar5,10,10,0x5a,0xf3,(char *)0x0);
  (pFVar5->super_Fl_Widget).label_.size = 0xb;
  pFVar6 = (Fl_Widget *)operator_new(0x80);
  Fl_Light_Button::Fl_Light_Button((Fl_Light_Button *)pFVar6,10,10,0x5a,0x14,"In Source");
  comment_in_source = (Fl_Light_Button *)pFVar6;
  Fl_Widget::tooltip(pFVar6,"Put the comment into the source (.cxx) file.");
  pFVar4 = comment_in_source;
  (comment_in_source->super_Fl_Button).super_Fl_Widget.label_.size = 0xb;
  (pFVar4->super_Fl_Button).super_Fl_Widget.when_ = '\0';
  pFVar6 = (Fl_Widget *)operator_new(0x80);
  Fl_Light_Button::Fl_Light_Button((Fl_Light_Button *)pFVar6,10,0x28,0x5a,0x14,"In Header");
  comment_in_header = (Fl_Light_Button *)pFVar6;
  Fl_Widget::tooltip(pFVar6,"Put the comment into the header (.h) file.");
  pFVar4 = comment_in_header;
  (comment_in_header->super_Fl_Button).super_Fl_Widget.label_.size = 0xb;
  (pFVar4->super_Fl_Button).super_Fl_Widget.when_ = '\0';
  this_03 = (Fl_Menu_Button *)operator_new(0x98);
  Fl_Menu_Button::Fl_Menu_Button(this_03,10,0x46,0x5a,0x14,"Predefined");
  comment_predefined = this_03;
  (this_03->super_Fl_Menu_).super_Fl_Widget.label_.size = 0xb;
  (this_03->super_Fl_Menu_).textsize_ = 0xb;
  pFVar7 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar7,10,100,0x5a,0x14,"Import...");
  comment_load = pFVar7;
  (pFVar7->super_Fl_Widget).label_.size = 0xb;
  pFVar6 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar6,10,0x84,0x5a,0x79,(char *)0x0);
  (pFVar6->label_).size = 0xb;
  pFVar8 = Fl_Group::current();
  pFVar8->resizable_ = pFVar6;
  Fl_Group::end(pFVar5);
  this_00->minw = 0x140;
  this_00->minh = 0xb4;
  this_00->maxw = 0;
  this_00->maxh = 0;
  this_00->dw = 0;
  this_00->dh = 0;
  this_00->aspect = 0;
  Fl_Window::size_range_(this_00);
  this = comment_panel;
  puVar1 = &(comment_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget.flags_;
  *puVar1 = *puVar1 | 0x4000;
  Fl_Group::end((Fl_Group *)this);
  return comment_panel;
}

Assistant:

Fl_Double_Window* make_comment_panel() {
  { Fl_Double_Window* o = comment_panel = new Fl_Double_Window(550, 280, "Comment Properties");
    comment_panel->labelsize(11);
    { CodeEditor* o = comment_input = new CodeEditor(110, 10, 430, 230);
      comment_input->box(FL_DOWN_BOX);
      comment_input->color(FL_BACKGROUND2_COLOR);
      comment_input->selection_color(FL_SELECTION_COLOR);
      comment_input->labeltype(FL_NORMAL_LABEL);
      comment_input->labelfont(0);
      comment_input->labelsize(11);
      comment_input->labelcolor(FL_FOREGROUND_COLOR);
      comment_input->textfont(4);
      comment_input->textsize(11);
      comment_input->align(Fl_Align(FL_ALIGN_TOP));
      comment_input->when(FL_WHEN_RELEASE);
      Fl_Group::current()->resizable(comment_input);
      o->when(FL_WHEN_ENTER_KEY_CHANGED|FL_WHEN_RELEASE);
    } // CodeEditor* comment_input
    { Fl_Group* o = new Fl_Group(110, 250, 430, 20);
      o->labelsize(11);
      { comment_panel_ok = new Fl_Return_Button(370, 250, 80, 20, "OK");
        comment_panel_ok->labelsize(11);
        comment_panel_ok->window()->hotspot(comment_panel_ok);
      } // Fl_Return_Button* comment_panel_ok
      { comment_panel_cancel = new Fl_Button(460, 250, 80, 20, "Cancel");
        comment_panel_cancel->shortcut(0xff1b);
        comment_panel_cancel->labelsize(11);
      } // Fl_Button* comment_panel_cancel
      { Fl_Box* o = new Fl_Box(110, 250, 250, 20);
        o->labelsize(11);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    { Fl_Group* o = new Fl_Group(10, 10, 90, 243);
      o->labelsize(11);
      { comment_in_source = new Fl_Light_Button(10, 10, 90, 20, "In Source");
        comment_in_source->tooltip("Put the comment into the source (.cxx) file.");
        comment_in_source->labelsize(11);
        comment_in_source->when(FL_WHEN_NEVER);
      } // Fl_Light_Button* comment_in_source
      { comment_in_header = new Fl_Light_Button(10, 40, 90, 20, "In Header");
        comment_in_header->tooltip("Put the comment into the header (.h) file.");
        comment_in_header->labelsize(11);
        comment_in_header->when(FL_WHEN_NEVER);
      } // Fl_Light_Button* comment_in_header
      { comment_predefined = new Fl_Menu_Button(10, 70, 90, 20, "Predefined");
        comment_predefined->labelsize(11);
        comment_predefined->textsize(11);
      } // Fl_Menu_Button* comment_predefined
      { comment_load = new Fl_Button(10, 100, 90, 20, "Import...");
        comment_load->labelsize(11);
      } // Fl_Button* comment_load
      { Fl_Box* o = new Fl_Box(10, 132, 90, 121);
        o->labelsize(11);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    o->size_range(320, 180);
    comment_panel->set_modal();
    comment_panel->end();
  } // Fl_Double_Window* comment_panel
  return comment_panel;
}